

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRangeList.cpp
# Opt level: O2

Error __thiscall
llvm::DWARFDebugRangeList::extract
          (DWARFDebugRangeList *this,DWARFDataExtractor *data,uint64_t *offset_ptr)

{
  size_t *psVar1;
  char cVar2;
  DWARFObject *pDVar3;
  uint64_t uVar4;
  char *pcVar5;
  uint64_t *in_RCX;
  char *Vals;
  error_code EC;
  error_code EC_00;
  undefined1 local_60 [8];
  RangeListEntry Entry;
  uint64_t prev_offset;
  
  (data->super_DataExtractor).Data.Data = (char *)0xffffffffffffffff;
  *(undefined1 *)&(data->super_DataExtractor).Data.Length = 0;
  pDVar3 = *(DWARFObject **)&(data->super_DataExtractor).IsLittleEndian;
  if (data->Obj != pDVar3) {
    data->Obj = pDVar3;
  }
  pcVar5 = (char *)*in_RCX;
  if (pcVar5 < (char *)offset_ptr[1]) {
    psVar1 = &(data->super_DataExtractor).Data.Length;
    cVar2 = *(char *)((long)offset_ptr + 0x11);
    *(char *)psVar1 = cVar2;
    if ((cVar2 != '\x04') && (cVar2 != '\b')) {
      pcVar5 = (char *)std::_V2::generic_category();
      EC_00._M_cat = (error_category *)0x16;
      EC_00._0_8_ = this;
      createStringError<unsigned_char>(EC_00,pcVar5,(uchar *)"invalid address size: %u");
      return (Error)(ErrorInfoBase *)this;
    }
    (data->super_DataExtractor).Data.Data = pcVar5;
    while( true ) {
      Entry.EndAddress = 0xffffffffffffffff;
      uVar4 = *in_RCX;
      Entry.SectionIndex = uVar4;
      local_60 = (undefined1  [8])
                 DWARFDataExtractor::getRelocatedAddress
                           ((DWARFDataExtractor *)offset_ptr,in_RCX,(uint64_t *)0x0);
      Entry.StartAddress =
           DWARFDataExtractor::getRelocatedAddress
                     ((DWARFDataExtractor *)offset_ptr,in_RCX,&Entry.EndAddress);
      if (*in_RCX != (ulong)(byte)*psVar1 * 2 + uVar4) break;
      if (Entry.StartAddress == 0 && local_60 == (undefined1  [8])0x0) {
        this->Offset = 1;
        return (Error)(ErrorInfoBase *)this;
      }
      std::
      vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
      ::push_back((vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
                   *)&(data->super_DataExtractor).IsLittleEndian,(value_type *)local_60);
    }
    (data->super_DataExtractor).Data.Data = (char *)0xffffffffffffffff;
    *(undefined1 *)&(data->super_DataExtractor).Data.Length = 0;
    pDVar3 = *(DWARFObject **)&(data->super_DataExtractor).IsLittleEndian;
    if (data->Obj != pDVar3) {
      data->Obj = pDVar3;
    }
    pcVar5 = (char *)std::_V2::generic_category();
    Vals = "invalid range list entry at offset 0x%lx";
  }
  else {
    pcVar5 = (char *)std::_V2::generic_category();
    Vals = "invalid range list offset 0x%lx";
  }
  EC._M_cat = (error_category *)0x16;
  EC._0_8_ = this;
  createStringError<unsigned_long>(EC,pcVar5,(unsigned_long *)Vals);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFDebugRangeList::extract(const DWARFDataExtractor &data,
                                   uint64_t *offset_ptr) {
  clear();
  if (!data.isValidOffset(*offset_ptr))
    return createStringError(errc::invalid_argument,
                       "invalid range list offset 0x%" PRIx64, *offset_ptr);

  AddressSize = data.getAddressSize();
  if (AddressSize != 4 && AddressSize != 8)
    return createStringError(errc::invalid_argument,
                       "invalid address size: %" PRIu8, AddressSize);
  Offset = *offset_ptr;
  while (true) {
    RangeListEntry Entry;
    Entry.SectionIndex = -1ULL;

    uint64_t prev_offset = *offset_ptr;
    Entry.StartAddress = data.getRelocatedAddress(offset_ptr);
    Entry.EndAddress =
        data.getRelocatedAddress(offset_ptr, &Entry.SectionIndex);

    // Check that both values were extracted correctly.
    if (*offset_ptr != prev_offset + 2 * AddressSize) {
      clear();
      return createStringError(errc::invalid_argument,
                         "invalid range list entry at offset 0x%" PRIx64,
                         prev_offset);
    }
    if (Entry.isEndOfListEntry())
      break;
    Entries.push_back(Entry);
  }
  return Error::success();
}